

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTRefCount.hpp
# Opt level: O2

ASTRefCount<antlr::BaseAST> * __thiscall
antlr::ASTRefCount<antlr::BaseAST>::operator=
          (ASTRefCount<antlr::BaseAST> *this,ASTRefCount<antlr::BaseAST> *other)

{
  uint *puVar1;
  ASTRef *pAVar2;
  ASTRef *this_00;
  
  pAVar2 = other->ref;
  this_00 = this->ref;
  if (pAVar2 != this_00) {
    if (pAVar2 != (ASTRef *)0x0) {
      pAVar2->count = pAVar2->count + 1;
    }
    if (this_00 != (ASTRef *)0x0) {
      puVar1 = &this_00->count;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        ASTRef::~ASTRef(this_00);
        operator_delete(this_00,0x10);
      }
    }
    this->ref = pAVar2;
  }
  return this;
}

Assistant:

ASTRefCount<T>& operator=(const ASTRefCount<T>& other)
	{
		if( other.ref != ref )
		{
			ASTRef* tmp = other.ref ? other.ref->increment() : 0;

			if (ref && ref->decrement())
				delete ref;

			ref=tmp;
		}
		return *this;
	}